

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O0

int io_close(lua_State *L)

{
  int iVar1;
  lua_State *L_local;
  
  iVar1 = lua_type(L,1);
  if (iVar1 == -1) {
    lua_getfield(L,-0xf4628,"_IO_output");
  }
  tofile(L);
  iVar1 = aux_close(L);
  return iVar1;
}

Assistant:

static int io_close(lua_State *L) {
    if (lua_isnone(L, 1))  /* no argument? */
        lua_getfield(L, LUA_REGISTRYINDEX, IO_OUTPUT);  /* use standard output */
    tofile(L);  /* make sure argument is an open stream */
    return aux_close(L);
}